

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall clipp::detail::match_t::match_t(match_t *this,arg_string *s,scoped_dfs_traverser *p)

{
  std::__cxx11::string::string((string *)this,(string *)s);
  scoped_dfs_traverser::scoped_dfs_traverser(&this->pos_,p);
  return;
}

Assistant:

match_t(arg_string s, scoped_dfs_traverser p):
        str_{std::move(s)}, pos_{std::move(p)}
    {}